

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void register_logging(char *filename,uint32_t *cats,int *level)

{
  Node *pNVar1;
  list<file_data> *this;
  int iVar2;
  Node *pNVar3;
  file_data node;
  iterator ret;
  file_data local_40;
  iterator local_28;
  
  if (first_register == '\0') {
    logging_init();
  }
  this = file_data_list;
  pNVar3 = file_data_list->mHead;
  pNVar1 = file_data_list->mTail;
  local_40.filename = filename;
  local_40.cats = cats;
  local_40.level = level;
  do {
    pNVar3 = pNVar3->next;
    if (pNVar3 == pNVar1) {
      JetHead::list<file_data>::push_back(this,&local_40);
      goto LAB_00122732;
    }
    iVar2 = strcasecmp((pNVar3->val).filename,filename);
  } while (iVar2 < 1);
  local_28.mNode = pNVar3;
  JetHead::list<file_data>::iterator::insertBefore(&local_28,&local_40);
LAB_00122732:
  if (jh_log_names_buffer != (char *)0x0) {
    free(jh_log_names_buffer);
    jh_log_names_buffer = (char *)0x0;
  }
  return;
}

Assistant:

void register_logging( const char *filename, uint32_t *cats, int *level )
{
	struct file_data node;

	TRACE_BEGIN(LOG_LVL_INFO);

	if ( first_register )
		logging_init();

	node.filename = filename;
	node.cats = cats;
	node.level = level;

	bool found = false;
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( strcasecmp( i->filename, filename) > 0 )
		{
			i.insertBefore(node);
			found = true;
			break;
		}
	}
	
	if ( not found )
	{
		file_data_list->push_back(node);
	}

	// if we have already built the name buffer then delete it since we just 
	//  changed it.
	if ( jh_log_names_buffer != NULL )
	{
		LOGGING_FREE( jh_log_names_buffer );
		jh_log_names_buffer = NULL;
	}
	
	TRACE_END();
}